

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_0016d6b8;
  std::ios::rdbuf((streambuf *)(&this->m_os + *(long *)(*(long *)&this->m_os + -0x18)));
  Stream::release(&this->m_stream);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector
            (&this->m_filterSets);
  std::ios_base::~ios_base((ios_base *)&this->field_0xd8);
  ConfigData::~ConfigData(&this->m_data);
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( std::cout.rdbuf() );
            m_stream.release();
        }